

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxwell_dist.hpp
# Opt level: O3

result_type_conflict2 __thiscall
trng::maxwell_dist<double>::cdf(maxwell_dist<double> *this,result_type_conflict2 x)

{
  double dVar1;
  double dVar2;
  
  dVar1 = erf((x * 0.7071067811865476) / (this->P).theta_);
  dVar2 = (this->P).theta_;
  dVar2 = exp((-x * x) / ((dVar2 + dVar2) * dVar2));
  return (dVar2 * x * -0.7978845608028654) / (this->P).theta_ + dVar1;
}

Assistant:

cdf(result_type x) const {
      return math::erf(x * math::constants<result_type>::one_over_sqrt_2 / P.theta()) -
             math::constants<result_type>::sqrt_2_over_pi * x *
                 math::exp(-x * x / (2 * P.theta() * P.theta())) / (P.theta());
    }